

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestPackage.cpp
# Opt level: O2

void __thiscall
tcu::TestPackageDescriptor::TestPackageDescriptor
          (TestPackageDescriptor *this,char *name,TestPackageCreateFunc createFunc)

{
  TestPackageRegistry *this_00;
  
  this_00 = TestPackageRegistry::getSingleton();
  TestPackageRegistry::registerPackage(this_00,name,createFunc);
  return;
}

Assistant:

TestPackageDescriptor::TestPackageDescriptor (const char* name, TestPackageCreateFunc createFunc)
{
	TestPackageRegistry::getSingleton()->registerPackage(name, createFunc);
}